

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm,SQInteger initialstacksize)

{
  bool bVar1;
  SQSharedState *in_RDI;
  SQVM *unaff_retaddr;
  SQVM *v;
  SQSharedState *ss;
  SQInteger in_stack_00000050;
  SQVM *in_stack_00000058;
  SQVM *in_stack_00000060;
  SQUnsignedInteger in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  SQVM *this;
  SQVM *local_28;
  SQObjectValue local_20;
  SQSharedState *local_10;
  SQSharedState *in_stack_fffffffffffffff8;
  
  local_20 = (in_RDI->_class_default_delegate).super_SQObject._unVal;
  local_10 = in_RDI;
  local_28 = (SQVM *)sq_vm_malloc(0x1142a9);
  SQVM::SQVM(unaff_retaddr,in_stack_fffffffffffffff8);
  bVar1 = SQVM::Init(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  if (bVar1) {
    this = (SQVM *)&stack0xffffffffffffffc8;
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,local_28);
    SQVM::Push(this,(SQObjectPtr *)local_10);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  }
  else {
    (**(local_28->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)();
    sq_vm_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    local_28 = (HSQUIRRELVM)0x0;
  }
  return local_28;
}

Assistant:

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm, SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    ss=_ss(friendvm);

    v= (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);

    if(v->Init(friendvm, initialstacksize)) {
        friendvm->Push(v);
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
}